

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O0

void __thiscall QStorageInfo::setPath(QStorageInfo *this,QString *path)

{
  bool bVar1;
  QString *in_RSI;
  QStorageInfoPrivate *in_stack_00000098;
  QString *in_stack_ffffffffffffffd8;
  QString *in_stack_ffffffffffffffe0;
  
  QExplicitlySharedDataPointer<QStorageInfoPrivate>::operator->
            ((QExplicitlySharedDataPointer<QStorageInfoPrivate> *)0x2f4371);
  bVar1 = ::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (!bVar1) {
    QExplicitlySharedDataPointer<QStorageInfoPrivate>::detach
              ((QExplicitlySharedDataPointer<QStorageInfoPrivate> *)in_stack_ffffffffffffffe0);
    QExplicitlySharedDataPointer<QStorageInfoPrivate>::operator->
              ((QExplicitlySharedDataPointer<QStorageInfoPrivate> *)0x2f43a8);
    QString::operator=(in_RSI,in_stack_ffffffffffffffd8);
    QExplicitlySharedDataPointer<QStorageInfoPrivate>::operator->
              ((QExplicitlySharedDataPointer<QStorageInfoPrivate> *)0x2f43c3);
    QStorageInfoPrivate::doStat(in_stack_00000098);
  }
  return;
}

Assistant:

void QStorageInfo::setPath(const QString &path)
{
    if (d->rootPath == path)
        return;
    d.detach();
    d->rootPath = path;
    d->doStat();
}